

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_classes.h
# Opt level: O2

unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
 get_output<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           (flagser_parameters *params)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  invalid_argument *this;
  long in_RSI;
  string err_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x60);
  bVar1 = std::operator==(__lhs,"betti");
  if (bVar1) {
    std::
    make_unique<betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,flagser_parameters_const&>
              ((flagser_parameters *)&err_msg);
  }
  else {
    bVar1 = std::operator==(__lhs,"barcode");
    if (bVar1) {
      std::
      make_unique<barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,flagser_parameters_const&>
                ((flagser_parameters *)&err_msg);
    }
    else {
      bVar1 = std::operator==(__lhs,"none");
      if (!bVar1) {
        std::operator+(&local_38,"The output format \"",__lhs);
        std::operator+(&err_msg,&local_38,"\" could not be found.");
        std::__cxx11::string::~string((string *)&local_38);
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,(string *)&err_msg);
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      std::
      make_unique<trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,flagser_parameters_const&>
                ((flagser_parameters *)&err_msg);
    }
  }
  *(pointer *)params = err_msg._M_dataplus._M_p;
  return (__uniq_ptr_data<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>,_true,_true>
          )(__uniq_ptr_data<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>,_true,_true>
            )params;
}

Assistant:

std::unique_ptr<output_t<Complex>> get_output(const flagser_parameters& params) {
	// using std namespace because of std::make_unique workaround
	// This restrict the scope to inside the function
	using namespace std;

	if (params.output_format == "betti") return make_unique<betti_output_t<Complex>>(params);
	if (params.output_format == "barcode") return make_unique<barcode_output_t<Complex>>(params);

	if (params.output_format == "none") return make_unique<trivial_output_t<Complex>>(params);

#ifdef WITH_HDF5
	if (params.output_format == "barcode:hdf5") return make_unique<barcode_hdf5_output_t<Complex>>(params);
#endif

	std::string err_msg = "The output format \"" + params.output_format + "\" could not be found.";
	throw std::invalid_argument(err_msg);
}